

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O2

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set,uint64_t sequence)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint64_t uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  size_t sVar13;
  quicly_local_cid_t *pqVar14;
  
  sVar13 = find_index(set,sequence);
  if (sVar13 != 0xffffffffffffffff) {
    if (set->cids[sVar13].state == QUICLY_LOCAL_CID_STATE_PENDING) {
      pqVar14 = set->cids + sVar13 + 1;
      for (; (sVar13 + 1 < set->_size && (pqVar14->state == QUICLY_LOCAL_CID_STATE_PENDING));
          pqVar14 = pqVar14 + 1) {
        uVar1 = *(undefined8 *)(pqVar14->stateless_reset_token + 0xb);
        uVar2 = *(undefined8 *)pqVar14;
        uVar3 = pqVar14->sequence;
        uVar4 = *(undefined8 *)(pqVar14->cid).cid;
        uVar5 = *(undefined8 *)((pqVar14->cid).cid + 8);
        uVar6 = *(undefined8 *)((pqVar14->cid).cid + 0x10);
        uVar7 = *(undefined8 *)(pqVar14->stateless_reset_token + 3);
        uVar8 = *(undefined8 *)((long)(pqVar14 + -1) + 8);
        uVar9 = *(undefined8 *)((long)(pqVar14 + -1) + 0x10);
        uVar10 = *(undefined8 *)((long)(pqVar14 + -1) + 0x18);
        uVar11 = *(undefined8 *)((long)(pqVar14 + -1) + 0x20);
        uVar12 = *(undefined8 *)((long)(pqVar14 + -1) + 0x28);
        *(undefined8 *)pqVar14 = *(undefined8 *)(pqVar14 + -1);
        pqVar14->sequence = uVar8;
        *(undefined8 *)(pqVar14->cid).cid = uVar9;
        *(undefined8 *)((pqVar14->cid).cid + 8) = uVar10;
        *(undefined8 *)((pqVar14->cid).cid + 0x10) = uVar11;
        *(undefined8 *)(pqVar14->stateless_reset_token + 3) = uVar12;
        *(undefined8 *)(pqVar14->stateless_reset_token + 0xb) =
             *(undefined8 *)((long)(pqVar14 + -1) + 0x30);
        *(undefined8 *)(pqVar14 + -1) = uVar2;
        *(uint64_t *)((long)(pqVar14 + -1) + 8) = uVar3;
        *(undefined8 *)((long)(pqVar14 + -1) + 0x10) = uVar4;
        *(undefined8 *)((long)(pqVar14 + -1) + 0x18) = uVar5;
        *(undefined8 *)((long)(pqVar14 + -1) + 0x20) = uVar6;
        *(undefined8 *)((long)(pqVar14 + -1) + 0x28) = uVar7;
        *(undefined8 *)((long)(pqVar14 + -1) + 0x30) = uVar1;
        sVar13 = sVar13 + 1;
      }
    }
    set->cids[sVar13].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  }
  return;
}

Assistant:

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return;

    do_mark_delivered(set, i);
}